

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

void scp_reply_full_name(SftpReplyBuilder *srb,ptrlen name,ptrlen longname,fxp_attrs attrs)

{
  SftpReplyBuilderVtable *pSVar1;
  char *p;
  ScpReplyReceiver *reply;
  SftpReplyBuilder *srb_local;
  ptrlen longname_local;
  ptrlen name_local;
  
  *(undefined1 *)&srb[-0xf].vt = 0;
  safefree(srb[-6].vt);
  pSVar1 = (SftpReplyBuilderVtable *)mkstr(name);
  srb[-6].vt = pSVar1;
  srb[-5].vt = (SftpReplyBuilderVtable *)name.len;
  memcpy(srb + -0xd,&attrs,0x38);
  return;
}

Assistant:

static void scp_reply_full_name(
    SftpReplyBuilder *srb, ptrlen name,
    ptrlen longname, struct fxp_attrs attrs)
{
    ScpReplyReceiver *reply = container_of(srb, ScpReplyReceiver, srb);
    char *p;
    reply->err = false;
    sfree((void *)reply->name.ptr);
    reply->name.ptr = p = mkstr(name);
    reply->name.len = name.len;
    reply->attrs = attrs;
}